

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

void nlohmann::json_abi_v3_11_3::detail::dtoa_impl::grisu2_round
               (char *buf,int len,uint64_t dist,uint64_t delta,uint64_t rest,uint64_t ten_k)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  undefined8 uVar4;
  ulong uVar5;
  bool bVar6;
  
  if (len < 1) {
    pcVar3 = "len >= 1";
    uVar4 = 0x4431;
  }
  else if (delta < dist) {
    pcVar3 = "dist <= delta";
    uVar4 = 0x4432;
  }
  else if (delta < rest) {
    pcVar3 = "rest <= delta";
    uVar4 = 0x4433;
  }
  else {
    if (ten_k != 0) {
      uVar1 = dist - rest;
      if (ten_k <= delta - rest && (rest <= dist && uVar1 != 0)) {
        uVar5 = rest + ten_k;
        uVar2 = delta - uVar5;
        do {
          if ((dist <= uVar5) && (uVar1 <= uVar5 - dist)) {
            return;
          }
          if (buf[(ulong)(uint)len - 1] == '0') {
            pcVar3 = "buf[len - 1] != \'0\'";
            uVar4 = 0x444d;
            goto LAB_0017d5e7;
          }
          buf[(ulong)(uint)len - 1] = buf[(ulong)(uint)len - 1] + -1;
          bVar6 = ten_k <= uVar2;
          uVar2 = uVar2 - ten_k;
          if (dist <= uVar5) {
            return;
          }
          uVar1 = uVar1 - ten_k;
          uVar5 = uVar5 + ten_k;
        } while (bVar6);
      }
      return;
    }
    pcVar3 = "ten_k > 0";
    uVar4 = 0x4434;
  }
LAB_0017d5e7:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/common/json.hpp",
             uVar4,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

inline void grisu2_round(char* buf, int len, std::uint64_t dist, std::uint64_t delta,
                         std::uint64_t rest, std::uint64_t ten_k)
{
    JSON_ASSERT(len >= 1);
    JSON_ASSERT(dist <= delta);
    JSON_ASSERT(rest <= delta);
    JSON_ASSERT(ten_k > 0);

    //               <--------------------------- delta ---->
    //                                  <---- dist --------->
    // --------------[------------------+-------------------]--------------
    //               M-                 w                   M+
    //
    //                                  ten_k
    //                                <------>
    //                                       <---- rest ---->
    // --------------[------------------+----+--------------]--------------
    //                                  w    V
    //                                       = buf * 10^k
    //
    // ten_k represents a unit-in-the-last-place in the decimal representation
    // stored in buf.
    // Decrement buf by ten_k while this takes buf closer to w.

    // The tests are written in this order to avoid overflow in unsigned
    // integer arithmetic.

    while (rest < dist
            && delta - rest >= ten_k
            && (rest + ten_k < dist || dist - rest > rest + ten_k - dist))
    {
        JSON_ASSERT(buf[len - 1] != '0');
        buf[len - 1]--;
        rest += ten_k;
    }
}